

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O3

void __thiscall Logger::~Logger(Logger *this)

{
  Buffer *logline;
  char **ppcVar1;
  size_t __n;
  pointer pcVar2;
  int iVar3;
  LogStream *pLVar4;
  char **ppcVar5;
  char *pcVar6;
  int iVar7;
  
  ppcVar1 = &(this->impl_).stream_.buffer_.cur_;
  pcVar6 = (this->impl_).stream_.buffer_.cur_;
  iVar7 = (int)ppcVar1;
  iVar3 = iVar7 - (int)pcVar6;
  if (4 < iVar3) {
    builtin_strncpy(pcVar6," -- ",4);
    pcVar6 = *ppcVar1 + 4;
    *ppcVar1 = pcVar6;
    iVar3 = iVar7 - (int)pcVar6;
  }
  __n = (this->impl_).basename_._M_string_length;
  if ((int)__n < iVar3) {
    memcpy(pcVar6,(this->impl_).basename_._M_dataplus._M_p,__n);
    pcVar6 = (this->impl_).stream_.buffer_.cur_ + __n;
    (this->impl_).stream_.buffer_.cur_ = pcVar6;
    iVar3 = iVar7 - (int)pcVar6;
  }
  if (1 < iVar3) {
    *pcVar6 = ':';
    *ppcVar1 = *ppcVar1 + 1;
  }
  pLVar4 = LogStream::operator<<((LogStream *)this,(this->impl_).line_);
  ppcVar5 = &(pLVar4->buffer_).cur_;
  pcVar6 = (pLVar4->buffer_).cur_;
  if (1 < (int)ppcVar5 - (int)pcVar6) {
    *pcVar6 = '\n';
    *ppcVar5 = *ppcVar5 + 1;
  }
  pcVar6 = *ppcVar1;
  pthread_once(&once_control,once_init);
  logline = &(this->impl_).stream_.buffer_;
  AsyncLogging::append
            (AsyncLogger_.super___shared_ptr<AsyncLogging,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             logline->data_,(int)pcVar6 - (int)logline);
  pcVar2 = (this->impl_).basename_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->impl_).basename_.field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

Logger::~Logger() {
    impl_.stream_ << " -- " << impl_.basename_ << ":" << impl_.line_ << "\n";
    const LogStream::Buffer& buf(stream().buffer());
    output(buf.data(), buf.length());
}